

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32_tests.cpp
# Opt level: O3

TestVector * __thiscall
anon_unknown.dwarf_3eb5d2::TestVector::operator()
          (TestVector *this,string *pub,string *prv,uint nChild)

{
  undefined8 *puVar1;
  long lVar2;
  pointer pTVar3;
  pointer pTVar4;
  undefined8 uVar5;
  ulong uVar6;
  pointer pTVar7;
  long *plVar8;
  undefined8 *puVar9;
  ulong uVar10;
  long *plVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  pointer pTVar15;
  _Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
  *this_00;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar3 = (this->vDerive).
           super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar3 == (this->vDerive).
                super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pTVar4 = (this->vDerive).
             super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)pTVar3 - (long)pTVar4;
    if (lVar13 == 0x7ffffffffffffff8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      goto LAB_002bdcba;
    }
    uVar10 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
    uVar6 = 1;
    if (pTVar3 != pTVar4) {
      uVar6 = uVar10;
    }
    this_00 = (_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
               *)(uVar6 + uVar10);
    if ((_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
         *)0x1c71c71c71c71c6 < this_00) {
      this_00 = (_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                 *)0x1c71c71c71c71c7;
    }
    if (CARRY8(uVar6,uVar10)) {
      this_00 = (_Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                 *)0x1c71c71c71c71c7;
    }
    pTVar7 = std::
             _Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
             ::_M_allocate(this_00,(size_t)pub);
    puVar1 = (undefined8 *)((long)pTVar7 + lVar13);
    puVar1[4] = 0;
    puVar1[5] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[6] = 0;
    puVar1[7] = 0;
    puVar1[8] = 0;
    *puVar1 = puVar1 + 2;
    puVar1[1] = 0;
    *(long *)((long)pTVar7 + lVar13 + 0x20) = (long)pTVar7 + lVar13 + 0x30;
    pTVar15 = pTVar7;
    if (pTVar3 != pTVar4) {
      lVar13 = 0;
      do {
        lVar14 = lVar13;
        plVar8 = (long *)((pTVar7->pub).field_2._M_local_buf + lVar14);
        *(long **)((long)&(pTVar7->pub)._M_dataplus._M_p + lVar14) = plVar8;
        puVar1 = (undefined8 *)((long)&(pTVar4->pub)._M_dataplus._M_p + lVar14);
        plVar11 = puVar1 + 2;
        if (plVar11 == (long *)*puVar1) {
          uVar5 = puVar1[3];
          *plVar8 = *plVar11;
          *(undefined8 *)((long)&(pTVar7->pub).field_2 + lVar14 + 8) = uVar5;
        }
        else {
          plVar8 = (long *)((long)&(pTVar7->pub)._M_dataplus._M_p + lVar14);
          *plVar8 = (long)*puVar1;
          plVar8[2] = *plVar11;
        }
        puVar1 = (undefined8 *)((long)&(pTVar4->pub)._M_dataplus._M_p + lVar14);
        puVar9 = puVar1 + 6;
        *(undefined8 *)((long)&(pTVar7->pub)._M_string_length + lVar14) = puVar1[1];
        *puVar1 = plVar11;
        puVar1[1] = 0;
        *(undefined1 *)(puVar1 + 2) = 0;
        pcVar12 = (pTVar7->prv).field_2._M_local_buf + lVar14;
        *(char **)((long)&(pTVar7->prv)._M_dataplus._M_p + lVar14) = pcVar12;
        if (puVar9 == (undefined8 *)puVar1[4]) {
          uVar5 = puVar1[7];
          *(undefined8 *)pcVar12 = *puVar9;
          *(undefined8 *)((long)&(pTVar7->prv).field_2 + lVar14 + 8) = uVar5;
        }
        else {
          *(undefined8 **)((long)&(pTVar7->prv)._M_dataplus._M_p + lVar14) = (undefined8 *)puVar1[4]
          ;
          *(undefined8 *)((long)&(pTVar7->prv).field_2 + lVar14) = *puVar9;
        }
        *(undefined8 *)((long)&(pTVar7->prv)._M_string_length + lVar14) =
             *(undefined8 *)((long)&(pTVar4->prv)._M_string_length + lVar14);
        *(undefined8 **)((long)&(pTVar4->prv)._M_dataplus._M_p + lVar14) = puVar9;
        *(undefined8 *)((long)&(pTVar4->prv)._M_string_length + lVar14) = 0;
        (pTVar4->prv).field_2._M_local_buf[lVar14] = '\0';
        *(undefined4 *)((long)&pTVar7->nChild + lVar14) =
             *(undefined4 *)((long)&pTVar4->nChild + lVar14);
        lVar13 = lVar14 + 0x48;
      } while ((pointer)((long)&pTVar4[1].pub._M_dataplus._M_p + lVar14) != pTVar3);
      pTVar15 = (pointer)((long)&pTVar7[1].pub._M_dataplus._M_p + lVar14);
    }
    pTVar15 = pTVar15 + 1;
    if (pTVar4 != (pointer)0x0) {
      operator_delete(pTVar4,(long)(this->vDerive).
                                   super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar4
                     );
    }
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_start = pTVar7;
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar15;
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar7 + (long)this_00;
  }
  else {
    (pTVar3->prv)._M_dataplus._M_p = (pointer)0x0;
    (pTVar3->prv)._M_string_length = 0;
    (pTVar3->prv).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar3->prv).field_2 + 8) = 0;
    (pTVar3->pub).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar3->pub).field_2 + 8) = 0;
    *(undefined8 *)&pTVar3->nChild = 0;
    (pTVar3->pub)._M_dataplus._M_p = (pointer)&(pTVar3->pub).field_2;
    (pTVar3->pub)._M_string_length = 0;
    (pTVar3->prv)._M_dataplus._M_p = (pointer)&(pTVar3->prv).field_2;
    pTVar15 = (this->vDerive).
              super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
              ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->vDerive).
    super__Vector_base<(anonymous_namespace)::TestDerivation,_std::allocator<(anonymous_namespace)::TestDerivation>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar15;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&pTVar15[-1].pub,pub);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&pTVar15[-1].prv,prv);
  pTVar15[-1].nChild = nChild;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return this;
  }
LAB_002bdcba:
  __stack_chk_fail();
}

Assistant:

TestVector& operator()(std::string pub, std::string prv, unsigned int nChild) {
        vDerive.emplace_back();
        TestDerivation &der = vDerive.back();
        der.pub = pub;
        der.prv = prv;
        der.nChild = nChild;
        return *this;
    }